

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ContNew * __thiscall wasm::Builder::makeContNew(Builder *this,HeapType type,Expression *func)

{
  Type local_30;
  ContNew *local_28;
  ContNew *ret;
  Expression *func_local;
  Builder *this_local;
  HeapType type_local;
  
  ret = (ContNew *)func;
  func_local = (Expression *)this;
  this_local = (Builder *)type.id;
  local_28 = MixedArena::alloc<wasm::ContNew>(&this->wasm->allocator);
  wasm::Type::Type(&local_30,(HeapType)this_local,NonNullable,Inexact);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)90>).super_Expression.type.id =
       local_30.id;
  local_28->func = (Expression *)ret;
  ContNew::finalize(local_28);
  return local_28;
}

Assistant:

ContNew* makeContNew(HeapType type, Expression* func) {
    auto* ret = wasm.allocator.alloc<ContNew>();
    ret->type = Type(type, NonNullable);
    ret->func = func;
    ret->finalize();
    return ret;
  }